

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

AActor * P_SpawnMissileXYZ(DVector3 *pos,AActor *source,AActor *dest,PClassActor *type,
                          bool checkspawn,AActor *owner)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  BYTE BVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  AActor *missile;
  undefined4 extraout_var;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  DVector3 velocity;
  DVector3 local_68;
  undefined1 local_48 [16];
  PClass *pPVar10;
  
  if (source != (AActor *)0x0) {
    if (dest == (AActor *)0x0) {
      pcVar1 = FName::NameData.NameArray
               [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
      pPVar10 = (source->super_DThinker).super_DObject.Class;
      if (pPVar10 == (PClass *)0x0) {
        iVar7 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
        pPVar10 = (PClass *)CONCAT44(extraout_var,iVar7);
        (source->super_DThinker).super_DObject.Class = pPVar10;
      }
      Printf("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",pcVar1,
             FName::NameData.NameArray[(pPVar10->super_PStruct).super_PNamedType.TypeName.Index].
             Text);
      return (AActor *)0x0;
    }
    dVar11 = pos->Z;
    if (((dVar11 != -2147483648.0) || (NAN(dVar11))) && ((dVar11 != 2147483647.0 || (NAN(dVar11)))))
    {
      pos->Z = dVar11 - source->Floorclip;
    }
    missile = AActor::StaticSpawn(type,pos,ALLOW_REPLACE,false);
    P_PlaySpawnSound(missile,source);
    if (owner == (AActor *)0x0) {
      owner = source;
    }
    (missile->target).field_0.p = owner;
    local_48._8_8_ = 0;
    local_48._0_8_ = missile->Speed;
    AActor::Vec3To(&local_68,source,dest);
    if (((missile->flags3).Value & 3) == 0) {
      dVar11 = (source->__Pos).Z;
      if (dest->Height <= pos->Z - dVar11) {
        local_68.Z = dVar11 + (dest->Height - pos->Z) + local_68.Z;
      }
    }
    else {
      local_68.Z = 0.0;
    }
    dVar11 = c_sqrt(local_68.Z * local_68.Z + local_68.Y * local_68.Y + local_68.X * local_68.X);
    dVar11 = (double)local_48._0_8_ / dVar11;
    (missile->Vel).Z = local_68.Z * dVar11;
    local_68.X = dVar11 * local_68.X;
    dVar11 = dVar11 * local_68.Y;
    (missile->Vel).X = local_68.X;
    (missile->Vel).Y = dVar11;
    if ((((dest->flags).Value & 0x40000) != 0) && (((source->flags6).Value & 0x1000000) == 0)) {
      uVar8 = FRandom::GenRand32(&pr_spawnmissile);
      uVar9 = FRandom::GenRand32(&pr_spawnmissile);
      dVar11 = FFastTrig::cos(&fasttrig,
                              (double)(int)((uVar8 & 0xff) - (uVar9 & 0xff)) * 0.087890625 *
                              11930464.711111112 + 6755399441055744.0);
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = dVar11;
      local_48._12_4_ = extraout_XMM0_Dd;
      dVar11 = FFastTrig::sin(&fasttrig,dVar11);
      dVar3 = (missile->Vel).X;
      dVar4 = (missile->Vel).Y;
      local_68.X = (double)local_48._0_8_ * dVar3 - dVar4 * dVar11;
      dVar11 = (double)local_48._0_8_ * dVar4 + dVar3 * dVar11;
      auVar2._8_4_ = SUB84(dVar11,0);
      auVar2._0_8_ = local_68.X;
      auVar2._12_4_ = (int)((ulong)dVar11 >> 0x20);
      (missile->Vel).X = local_68.X;
      (missile->Vel).Y = (double)auVar2._8_8_;
    }
    dVar11 = c_atan2(dVar11,local_68.X);
    (missile->Angles).Yaw.Degrees = dVar11 * 57.29577951308232;
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (owner->player == (player_t *)0x0) {
        BVar5 = '\0';
      }
      else {
        BVar5 = (char)((int)owner->player - 0xa60290U >> 5) * '=' + '\x01';
      }
      missile->FriendPlayer = BVar5;
    }
    if (!checkspawn) {
      return missile;
    }
    bVar6 = P_CheckMissileSpawn(missile,source->radius);
    if (bVar6) {
      return missile;
    }
  }
  return (AActor *)0x0;
}

Assistant:

AActor *P_SpawnMissileXYZ (DVector3 pos, AActor *source, AActor *dest, PClassActor *type, bool checkspawn, AActor *owner)
{
	if (source == NULL)
	{
		return NULL;
	}

	if (dest == NULL)
	{
		Printf ("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",
			type->TypeName.GetChars(), source->GetClass()->TypeName.GetChars());
		return NULL;
	}

	if (pos.Z != ONFLOORZ && pos.Z != ONCEILINGZ)
	{
		pos.Z -= source->Floorclip;
	}

	AActor *th = Spawn (type, pos, ALLOW_REPLACE);
	
	P_PlaySpawnSound(th, source);

	// record missile's originator
	if (owner == NULL) owner = source;
	th->target = owner;

	double speed = th->Speed;

	// [RH]
	// Hexen calculates the missile velocity based on the source's location.
	// Would it be more useful to base it on the actual position of the
	// missile?
	// Answer: No, because this way, you can set up sets of parallel missiles.

	DVector3 velocity = source->Vec3To(dest);
	// Floor and ceiling huggers should never have a vertical component to their velocity
	if (th->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
	{
		velocity.Z = 0;
	}
	// [RH] Adjust the trajectory if the missile will go over the target's head.
	else if (pos.Z - source->Z() >= dest->Height)
	{
		velocity.Z += (dest->Height - pos.Z + source->Z());
	}
	th->Vel = velocity.Resized(speed);

	// invisible target: rotate velocity vector in 2D
	// [RC] Now monsters can aim at invisible player as if they were fully visible.
	if (dest->flags & MF_SHADOW && !(source->flags6 & MF6_SEEINVISIBLE))
	{
		DAngle an = pr_spawnmissile.Random2() * (22.5 / 256);
		double c = an.Cos();
		double s = an.Sin();
		
		double newx = th->Vel.X * c - th->Vel.Y * s;
		double newy = th->Vel.X * s + th->Vel.Y * c;

		th->Vel.X = newx;
		th->Vel.Y = newy;
	}

	th->AngleFromVel();

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	return (!checkspawn || P_CheckMissileSpawn (th, source->radius)) ? th : NULL;
}